

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void errorAt(Token *token,char *message)

{
  if (parser.panicMode) {
    return;
  }
  parser.panicMode = true;
  fprintf(_stderr,"[line %d] Error",(ulong)(uint)token->line);
  if (token->type != TOKEN_ERROR) {
    if (token->type == TOKEN_EOF) {
      fwrite(" at end",7,1,_stderr);
    }
    else {
      fprintf(_stderr," at \'%.*s\'",(ulong)(uint)token->length,token->start);
    }
  }
  fprintf(_stderr,": %s\n",message);
  parser.hadError = true;
  return;
}

Assistant:

static void errorAt(Token *token, const char *message) {
    if (parser.panicMode) return;

    parser.panicMode = true;

    fprintf(stderr, "[line %d] Error", token->line);

    if (token->type == TOKEN_EOF) {
        fprintf(stderr, " at end");
    } else if (token->type == TOKEN_ERROR) {
        // Nothing.
    } else {
        fprintf(stderr, " at '%.*s'", token->length, token->start);
    }

    fprintf(stderr, ": %s\n", message);
    parser.hadError = true;
}